

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeArrays.hpp
# Opt level: O1

vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *
njoy::ENDFtk::section::Type<14>::makeArrays
          (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
           *__return_storage_ptr__,vector<double,_std::allocator<double>_> *energies,
          vector<double,_std::allocator<double>_> *levels)

{
  pointer *ppaVar1;
  iterator __position;
  undefined8 *puVar2;
  ulong uVar3;
  ulong uVar4;
  array<double,_2UL> local_40;
  
  (__return_storage_ptr__->
  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar4 = (long)(energies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(energies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3;
  std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::reserve
            (__return_storage_ptr__,uVar4 & 0xffffffff);
  if ((uVar4 & 0xffffffff) ==
      (long)(levels->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(levels->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3) {
    if ((uint)uVar4 != 0) {
      uVar3 = 0;
      do {
        local_40._M_elems[0] =
             (energies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar3];
        local_40._M_elems[1] =
             (levels->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar3];
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>::
          _M_realloc_insert<std::array<double,2ul>>
                    ((vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>> *)
                     __return_storage_ptr__,__position,&local_40);
        }
        else {
          (__position._M_current)->_M_elems[0] = local_40._M_elems[0];
          (__position._M_current)->_M_elems[1] = local_40._M_elems[1];
          ppaVar1 = &(__return_storage_ptr__->
                     super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
        }
        uVar3 = uVar3 + 1;
      } while ((uVar4 & 0xffffffff) != uVar3);
    }
    return __return_storage_ptr__;
  }
  tools::Log::error<char_const*>
            ("Encountered inconsistent number of photon energy values and level energy values");
  tools::Log::info<char_const*,unsigned_int>("Number of photon energy values: {}",(uint)uVar4);
  tools::Log::info<char_const*,unsigned_long>
            ("Number of energy level values: {}",
             (long)(levels->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(levels->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = getenv;
  __cxa_throw(puVar2,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static std::vector< std::array< double, 2 > >
makeArrays( std::vector< double >&& energies,
            std::vector< double >&& levels ) {

  std::vector< std::array< double, 2 > > sequence;
  unsigned int size = energies.size();
  sequence.reserve( size );

  if ( size != levels.size() ) {

    Log::error( "Encountered inconsistent number of photon energy values and "
                "level energy values" );
    Log::info( "Number of photon energy values: {}", size );
    Log::info( "Number of energy level values: {}", levels.size() );
    throw std::exception();
  }

  for ( unsigned int i = 0; i < size; ++i ) {

    sequence.push_back( {{ energies[i], levels[i] }} );
  }

  return sequence;
}